

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O3

void init_gbasystem(char *romfile,char *bios_file,_Bool enable_frontend)

{
  long lVar1;
  gbamem_t *pgVar2;
  char *pcVar3;
  char **ppcVar4;
  long lVar5;
  
  mem = init_mem();
  load_gbarom(romfile);
  pcVar3 = get_backup_path(romfile);
  pgVar2 = mem;
  mem->backup_path = pcVar3;
  ppcVar4 = (char **)malloc(0x50);
  pgVar2->savestate_path = ppcVar4;
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    pcVar3 = get_savestate_path(romfile,(int)lVar1);
    mem->savestate_path[lVar5] = pcVar3;
    lVar5 = lVar1;
  } while (lVar1 != 10);
  if (bios_file != (char *)0x0) {
    load_alternate_bios(bios_file);
  }
  cpu = init_arm7tdmi(gba_read_byte,gba_read_half,gba_read_word,gba_write_byte,gba_write_half,
                      gba_write_word);
  fill_pipe(cpu);
  ppu = init_ppu(enable_frontend);
  bus = init_gbabus();
  apu = init_apu(enable_frontend);
  return;
}

Assistant:

void init_gbasystem(const char* romfile, const char* bios_file, bool enable_frontend) {
    mem = init_mem();

    load_gbarom(romfile);
    mem->backup_path = get_backup_path(romfile);
    mem->savestate_path = malloc(NUM_SAVESTATES * sizeof(char*));
    for (int i = 0; i < NUM_SAVESTATES; i++) {
        mem->savestate_path[i] = get_savestate_path(romfile, i + 1);
    }
    if (bios_file) {
        load_alternate_bios(bios_file);
    }

    // Initialize the CPU, hook it up to the GBA bus
    cpu = init_arm7tdmi(gba_read_byte,
                        gba_read_half,
                        gba_read_word,
                        gba_write_byte,
                        gba_write_half,
                        gba_write_word);
    fill_pipe(cpu);

    ppu = init_ppu(enable_frontend);
    bus = init_gbabus();
    apu = init_apu(enable_frontend);
}